

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void canonical_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
               (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
               size_t times)

{
  ostream *this;
  ulong in_RSI;
  double dVar1;
  size_t i;
  double total;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_000000a0;
  ulong local_20;
  double local_18;
  
  local_18 = 0.0;
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    dVar1 = std::
            generate_canonical<double,8ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                      (in_stack_000000a0);
    local_18 = dVar1 + local_18;
  }
  if ((local_18 == 0.0) && (!NAN(local_18))) {
    this = std::operator<<((ostream *)&std::cout,"This is to avoid compiler optimizations.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void canonical_single_run (G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += generate_canonical<Real, sizeof(Real)>(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}